

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O0

size_t ZSTD_compressBlock_greedy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize)

{
  int iVar1;
  seqDef **ppsVar2;
  U32 UVar3;
  U32 UVar4;
  uint uVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  undefined8 in_RCX;
  uint *in_RDX;
  long in_RDI;
  BYTE *in_R8;
  long in_R9;
  bool bVar9;
  BYTE *repEnd_3;
  BYTE *repMatch_3;
  BYTE *repBase_3;
  U32 repIndex_3;
  size_t litLength;
  BYTE *mStart;
  BYTE *match;
  U32 matchIndex;
  int gain1_3;
  int gain2_3;
  size_t ml2_2;
  size_t offset2_1;
  int gain1_2;
  int gain2_2;
  size_t repLength_1;
  BYTE *repEnd_2;
  BYTE *repMatch_2;
  BYTE *repBase_2;
  U32 repIndex_2;
  int gain1_1;
  int gain2_1;
  size_t ml2_1;
  size_t offset2;
  int gain1;
  int gain2;
  size_t repLength;
  BYTE *repEnd_1;
  BYTE *repMatch_1;
  BYTE *repBase_1;
  U32 repIndex_1;
  size_t ml2;
  size_t offsetFound;
  BYTE *repEnd;
  BYTE *repMatch;
  BYTE *repBase;
  U32 repIndex;
  U32 current;
  BYTE *start;
  size_t offset;
  size_t matchLength;
  U32 offset_2;
  U32 offset_1;
  searchMax_f searchMax;
  BYTE *dictStart;
  BYTE *dictEnd;
  BYTE *dictBase;
  BYTE *prefixStart;
  U32 lowestIndex;
  U32 dictLimit;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  BYTE *anchor;
  BYTE *ip;
  BYTE *istart;
  U32 in_stack_fffffffffffffd6c;
  BYTE *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  U32 in_stack_fffffffffffffd7c;
  seqStore_t *in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  BYTE *in_stack_fffffffffffffd90;
  BYTE *in_stack_fffffffffffffd98;
  BYTE *in_stack_fffffffffffffda0;
  BYTE *in_stack_fffffffffffffda8;
  BYTE *local_248;
  seqStore_t *local_238;
  BYTE *local_218;
  seqStore_t *local_208;
  BYTE *local_200;
  seqStore_t *local_1f0;
  BYTE *local_188;
  ulong local_168;
  int local_160;
  int local_15c;
  ulong local_158;
  BYTE *local_150;
  void *local_148;
  seqStore_t *local_140;
  uint local_134;
  int local_130;
  int local_12c;
  ulong local_128;
  ulong local_120;
  int local_118;
  int local_114;
  ulong local_110;
  BYTE *local_108;
  void *local_100;
  seqStore_t *local_f8;
  uint local_ec;
  ulong local_e8;
  ulong local_e0;
  BYTE *local_d8;
  void *local_d0;
  seqStore_t *local_c8;
  uint local_c0;
  int local_bc;
  BYTE *local_b8;
  ulong local_b0;
  ulong local_a8;
  uint local_a0;
  uint local_9c;
  code *local_98;
  BYTE *local_90;
  BYTE *local_88;
  seqStore_t *local_80;
  BYTE *local_78;
  uint local_70;
  uint local_6c;
  seqStore_t *local_68;
  BYTE *local_60;
  BYTE *local_58;
  BYTE *local_50;
  BYTE *local_48;
  int local_38;
  undefined4 local_34;
  undefined8 local_20;
  uint *local_18;
  long local_8;
  
  local_34 = 0;
  local_38 = 0;
  local_58 = in_R8 + in_R9;
  local_60 = local_58 + -8;
  local_68 = *(seqStore_t **)(in_RDI + 8);
  local_6c = *(uint *)(in_RDI + 0x18);
  local_70 = *(uint *)(in_RDI + 0x1c);
  local_78 = (BYTE *)((long)&local_68->sequencesStart + (ulong)local_6c);
  local_80 = *(seqStore_t **)(in_RDI + 0x10);
  local_88 = (BYTE *)((long)&local_80->sequencesStart + (ulong)local_6c);
  local_90 = (BYTE *)((long)&local_80->sequencesStart + (ulong)local_70);
  local_98 = ZSTD_HcFindBestMatch_extDict_selectMLS;
  local_9c = *in_RDX;
  local_a0 = in_RDX[1];
  *(undefined4 *)(in_RDI + 0x28) = *(undefined4 *)(in_RDI + 0x24);
  local_48 = in_R8 + (int)(uint)(in_R8 == local_78);
  local_50 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
LAB_002174de:
  do {
    if (local_60 <= local_48) {
      *local_18 = local_9c;
      local_18[1] = local_a0;
      return (long)local_58 - (long)local_50;
    }
    local_a8 = 0;
    local_b0 = 0;
    local_b8 = local_48 + 1;
    local_bc = (int)local_48 - (int)local_68;
    local_c0 = (local_bc + 1) - local_9c;
    if (local_c0 < local_6c) {
      local_1f0 = local_80;
    }
    else {
      local_1f0 = local_68;
    }
    local_c8 = local_1f0;
    local_d0 = (void *)((long)&local_1f0->sequencesStart + (ulong)local_c0);
    if (2 < (local_6c - 1) - local_c0 && local_70 < local_c0) {
      UVar3 = MEM_read32(local_48 + 1);
      UVar4 = MEM_read32(local_d0);
      if (UVar3 != UVar4) goto LAB_002176bc;
      if (local_c0 < local_6c) {
        local_200 = local_88;
      }
      else {
        local_200 = local_58;
      }
      local_d8 = local_200;
      sVar6 = ZSTD_count_2segments
                        (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                         in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                         (BYTE *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
      local_a8 = sVar6 + 4;
      if (local_38 != 0) goto LAB_002176bc;
LAB_00217f9e:
      ZSTD_storeSeq(in_stack_fffffffffffffd80,
                    CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                    in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,0x217fec);
      for (local_48 = local_b8 + local_a8; local_50 = local_48, local_48 <= local_60;
          local_48 = local_48 + local_a8) {
        uVar5 = ((int)local_48 - (int)local_68) - local_a0;
        in_stack_fffffffffffffd80 = local_68;
        if (uVar5 < local_6c) {
          in_stack_fffffffffffffd80 = local_80;
        }
        ppsVar2 = &in_stack_fffffffffffffd80->sequencesStart;
        if ((local_6c - 1) - uVar5 < 3 || uVar5 <= local_70) break;
        in_stack_fffffffffffffd7c = MEM_read32(local_48);
        UVar3 = MEM_read32((void *)((long)ppsVar2 + (ulong)uVar5));
        if (in_stack_fffffffffffffd7c != UVar3) break;
        in_stack_fffffffffffffd70 = local_58;
        if (uVar5 < local_6c) {
          in_stack_fffffffffffffd70 = local_88;
        }
        sVar6 = ZSTD_count_2segments
                          (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                           in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                           (BYTE *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
        uVar5 = local_a0;
        local_a8 = sVar6 + 4;
        local_b0 = (ulong)local_a0;
        local_a0 = local_9c;
        local_9c = uVar5;
        ZSTD_storeSeq(in_stack_fffffffffffffd80,
                      CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                      in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,0x2181d0);
      }
      goto LAB_002174de;
    }
LAB_002176bc:
    local_e0 = 99999999;
    local_e8 = (*local_98)(local_8,local_20,local_48,local_58,&local_e0);
    if (local_a8 < local_e8) {
      local_b8 = local_48;
      local_b0 = local_e0;
      local_a8 = local_e8;
    }
    if (3 < local_a8) {
      if (local_38 != 0) {
        while (local_48 < local_60) {
          local_48 = local_48 + 1;
          local_bc = local_bc + 1;
          if (local_b0 != 0) {
            local_ec = local_bc - local_9c;
            if (local_ec < local_6c) {
              local_208 = local_80;
            }
            else {
              local_208 = local_68;
            }
            local_f8 = local_208;
            local_100 = (void *)((long)&local_208->sequencesStart + (ulong)local_ec);
            if (2 < (local_6c - 1) - local_ec && local_70 < local_ec) {
              UVar3 = MEM_read32(local_48);
              UVar4 = MEM_read32(local_100);
              if (UVar3 == UVar4) {
                if (local_ec < local_6c) {
                  local_218 = local_88;
                }
                else {
                  local_218 = local_58;
                }
                local_108 = local_218;
                sVar6 = ZSTD_count_2segments
                                  (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                                   in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                                   (BYTE *)CONCAT17(in_stack_fffffffffffffd8f,
                                                    in_stack_fffffffffffffd88));
                local_110 = sVar6 + 4;
                local_114 = (int)local_110 * 3;
                iVar1 = (int)local_a8;
                UVar3 = ZSTD_highbit32((int)local_b0 + 1);
                local_118 = (iVar1 * 3 - UVar3) + 1;
                if ((3 < local_110) && (local_118 < local_114)) {
                  local_a8 = local_110;
                  local_b0 = 0;
                  local_b8 = local_48;
                }
              }
            }
          }
          local_120 = 99999999;
          local_128 = (*local_98)(local_8,local_20,local_48,local_58,&local_120);
          lVar7 = local_128 << 2;
          UVar3 = ZSTD_highbit32((int)local_120 + 1);
          local_12c = (int)lVar7 - UVar3;
          lVar7 = local_a8 << 2;
          UVar3 = ZSTD_highbit32((int)local_b0 + 1);
          local_130 = ((int)lVar7 - UVar3) + 4;
          if ((local_128 < 4) || (local_12c <= local_130)) {
            if ((local_38 != 2) || (local_60 <= local_48)) break;
            local_48 = local_48 + 1;
            local_bc = local_bc + 1;
            if (local_b0 != 0) {
              local_134 = local_bc - local_9c;
              if (local_134 < local_6c) {
                local_238 = local_80;
              }
              else {
                local_238 = local_68;
              }
              local_140 = local_238;
              local_148 = (void *)((long)&local_238->sequencesStart + (ulong)local_134);
              if (2 < (local_6c - 1) - local_134 && local_70 < local_134) {
                UVar3 = MEM_read32(local_48);
                UVar4 = MEM_read32(local_148);
                if (UVar3 == UVar4) {
                  if (local_134 < local_6c) {
                    local_248 = local_88;
                  }
                  else {
                    local_248 = local_58;
                  }
                  local_150 = local_248;
                  sVar6 = ZSTD_count_2segments
                                    (in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                                     in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                                     (BYTE *)CONCAT17(in_stack_fffffffffffffd8f,
                                                      in_stack_fffffffffffffd88));
                  local_158 = sVar6 + 4;
                  local_15c = (int)local_158 * 4;
                  lVar7 = local_a8 << 2;
                  UVar3 = ZSTD_highbit32((int)local_b0 + 1);
                  local_160 = ((int)lVar7 - UVar3) + 1;
                  if ((3 < local_158) && (local_160 < local_15c)) {
                    local_a8 = local_158;
                    local_b0 = 0;
                    local_b8 = local_48;
                  }
                }
              }
            }
            local_168 = 99999999;
            uVar8 = (*local_98)(local_8,local_20,local_48,local_58,&local_168);
            in_stack_fffffffffffffda0 = (BYTE *)(uVar8 << 2);
            UVar3 = ZSTD_highbit32((int)local_168 + 1);
            iVar1 = (int)in_stack_fffffffffffffda0;
            in_stack_fffffffffffffda8 = (BYTE *)(local_a8 << 2);
            UVar4 = ZSTD_highbit32((int)local_b0 + 1);
            if ((uVar8 < 4) ||
               ((int)(iVar1 - UVar3) <= (int)(((int)in_stack_fffffffffffffda8 - UVar4) + 7))) break;
            local_b0 = local_168;
            local_b8 = local_48;
            local_a8 = uVar8;
          }
          else {
            local_b0 = local_120;
            local_b8 = local_48;
            local_a8 = local_128;
          }
        }
      }
      if (local_b0 != 0) {
        uVar5 = ((int)local_b8 - (int)local_68) - ((int)local_b0 + -2);
        if (uVar5 < local_6c) {
          local_188 = (BYTE *)((long)&local_80->sequencesStart + (ulong)uVar5);
          in_stack_fffffffffffffd98 = local_188;
          in_stack_fffffffffffffd90 = local_90;
        }
        else {
          local_188 = (BYTE *)((long)&local_68->sequencesStart + (ulong)uVar5);
          in_stack_fffffffffffffd98 = local_188;
          in_stack_fffffffffffffd90 = local_78;
        }
        while( true ) {
          bVar9 = false;
          if ((local_50 < local_b8) && (bVar9 = false, in_stack_fffffffffffffd90 < local_188)) {
            bVar9 = local_b8[-1] == local_188[-1];
          }
          if (!bVar9) break;
          local_b8 = local_b8 + -1;
          local_188 = local_188 + -1;
          local_a8 = local_a8 + 1;
        }
        local_a0 = local_9c;
        local_9c = (int)local_b0 - 2;
        in_stack_fffffffffffffd8f = 0;
      }
      goto LAB_00217f9e;
    }
    local_48 = local_48 + ((long)local_48 - (long)local_50 >> 8) + 1;
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, cParams, src, srcSize, 0, 0);
}